

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.cxx
# Opt level: O2

bool cmStrToULong(char *str,unsigned_long *value)

{
  char *pcVar1;
  bool bVar2;
  char *in_RAX;
  int *piVar3;
  ulong uVar4;
  char *__nptr;
  char *endp;
  
  endp = in_RAX;
  piVar3 = __errno_location();
  *piVar3 = 0;
  __nptr = str + -1;
  do {
    pcVar1 = __nptr + 1;
    __nptr = __nptr + 1;
    bVar2 = cmIsSpace(*pcVar1);
  } while (bVar2);
  if (*__nptr == '-') {
    bVar2 = false;
  }
  else {
    uVar4 = strtoul(__nptr,&endp,10);
    *value = uVar4;
    bVar2 = false;
    if ((__nptr != endp) && (*endp == '\0')) {
      bVar2 = *piVar3 == 0;
    }
  }
  return bVar2;
}

Assistant:

bool cmStrToULong(const char* str, unsigned long* value)
{
  errno = 0;
  char* endp;
  while (cmIsSpace(*str)) {
    ++str;
  }
  if (*str == '-') {
    return false;
  }
  *value = strtoul(str, &endp, 10);
  return (*endp == '\0') && (endp != str) && (errno == 0);
}